

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O3

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
sort_function::evaluate
          (sort_function *this,
          vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          *args,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *context,error_code *ec)

{
  pointer ppVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  size_t sVar5;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar6;
  size_t sVar7;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this_00;
  __normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  __seed;
  long lVar8;
  reference pbVar9;
  assertion_error *this_01;
  uint uVar10;
  iterator iVar11;
  array_range_type aVar12;
  string local_50;
  
  ppVar1 = (args->
           super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4 !=
      (this->
      super_function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
      ).arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value) {
    this_01 = (assertion_error *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"assertion \'args.size() == *this->arity()\' failed at  <> :0",""
              );
    assertion_error::assertion_error(this_01,&local_50);
    __cxa_throw(this_01,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (ppVar1->type_ == value) {
    this_00 = (ppVar1->field_1).value_;
    pbVar6 = this_00;
    while (uVar10 = *(byte *)&pbVar6->field_0 & 0xf, uVar10 - 8 < 2) {
      pbVar6 = *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)
                ((long)&pbVar6->field_0 + 8);
    }
    if (uVar10 == 0xe) {
      sVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(this_00);
      if (1 < sVar5) {
        pbVar6 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(this_00,0);
        bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number(pbVar6);
        pbVar6 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(this_00,0);
        bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string(pbVar6);
        if (!bVar2 && !bVar3) goto LAB_00368fea;
        sVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(this_00);
        if (1 < sVar5) {
          sVar5 = 1;
          do {
            pbVar6 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                               (this_00,sVar5);
            bVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number
                              (pbVar6);
            if (bVar2 != bVar4) goto LAB_00368fea;
            pbVar6 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                               (this_00,sVar5);
            bVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                              (pbVar6);
            if (bVar3 != bVar4) goto LAB_00368fea;
            sVar5 = sVar5 + 1;
            sVar7 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(this_00);
          } while (sVar5 < sVar7);
        }
        this_00 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                  ::
                  create_json<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
                            ((eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                              *)context,this_00);
        aVar12 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                           (this_00);
        __seed._M_current =
             (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             aVar12.first_._M_current;
        aVar12 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                           (this_00);
        iVar11 = aVar12.last_._M_current;
        if (__seed._M_current != iVar11._M_current) {
          lVar8 = (long)iVar11._M_current - (long)__seed._M_current >> 4;
          std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                               *)&local_50,__seed,(lVar8 - (lVar8 + 1 >> 0x3f)) + 1 >> 1);
          if (local_50.field_2._M_allocated_capacity == 0) {
            std::
            __inplace_stable_sort<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>*,std::vector<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (__seed._M_current,iVar11._M_current);
          }
          else {
            std::
            __stable_sort_adaptive<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>*,std::vector<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>*,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (__seed._M_current,iVar11._M_current,local_50.field_2._M_allocated_capacity,
                       local_50._M_string_length);
          }
          std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          ::~_Temporary_buffer
                    ((_Temporary_buffer<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      *)&local_50);
        }
      }
      return this_00;
    }
  }
LAB_00368fea:
  std::error_code::operator=(ec,invalid_type);
  pbVar9 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           ::null_value(context);
  return pbVar9;
}

Assistant:

reference evaluate(const std::vector<parameter_type>& args, eval_context<Json>& context, std::error_code& ec) const override
            {
                JSONCONS_ASSERT(args.size() == *this->arity());

                if (!args[0].is_value())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                reference arg0 = args[0].value();
                if (!arg0.is_array())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }
                if (arg0.size() <= 1)
                {
                    return arg0;
                }

                bool is_number = arg0.at(0).is_number();
                bool is_string = arg0.at(0).is_string();
                if (!is_number && !is_string)
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                for (std::size_t i = 1; i < arg0.size(); ++i)
                {
                    if (arg0.at(i).is_number() != is_number || arg0.at(i).is_string() != is_string)
                    {
                        ec = jmespath_errc::invalid_type;
                        return context.null_value();
                    }
                }

                auto v = context.create_json(arg0);
                std::stable_sort((v->array_range()).begin(), (v->array_range()).end());
                return *v;
            }